

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4d3168::SpotController::collective_flush
          (SpotController *this,OutputStream *stream,Comm *comm)

{
  CaliperMetadataDB *this_00;
  _func_int *p_Var1;
  anon_union_8_7_33918203_for_value aVar2;
  uint64_t uVar3;
  GlobalData *pGVar4;
  _Alloc_hider formatstr;
  Comm *pCVar5;
  element_type *peVar6;
  pointer pLVar7;
  undefined8 uVar8;
  bool bVar9;
  StreamType SVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ostream *poVar14;
  ChannelBody *pCVar15;
  Node *pNVar16;
  CaliperMetadataAccessInterface CVar17;
  pointer pLVar18;
  string *psVar19;
  char *pcVar20;
  Attribute AVar21;
  char *ext;
  AggregationOp *extraout_RDX;
  AggregationOp *extraout_RDX_00;
  AggregationOp *extraout_RDX_01;
  AggregationOp *extraout_RDX_02;
  AggregationOp *pAVar22;
  AggregationOp *extraout_RDX_03;
  AggregationOp *extraout_RDX_04;
  AggregationOp *op_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  AggregationOp *op;
  uint uVar24;
  Caliper c_1;
  string output;
  allocator<char> local_399;
  Options *local_398;
  Comm *local_390;
  Aggregator output_agg;
  Variant v_data;
  Attribute chn_attr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  CaliWriter writer;
  Aggregator cross_agg;
  shared_ptr<(anonymous_namespace)::SpotTimeseriesController> tsc;
  Aggregator summary_cross_agg;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_> infovec;
  ChannelPtr p;
  Attribute fmt_attr;
  Caliper c;
  string outdir;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100 [3];
  int local_50;
  _Vector_base<cali::Entry,_std::allocator<cali::Entry>_> local_48;
  
  bVar9 = cali::ChannelController::is_instantiated((ChannelController *)this);
  if (bVar9) {
    std::ofstream::ofstream((Log *)&outdir);
    local_50 = 1;
    poVar14 = cali::Log::stream((Log *)&outdir);
    cali::ChannelController::name_abi_cxx11_(&output,(ChannelController *)this);
    poVar14 = std::operator<<(poVar14,(string *)&output);
    poVar14 = std::operator<<(poVar14,": Flushing Caliper data");
    std::endl<char,std::char_traits<char>>(poVar14);
    std::__cxx11::string::~string((string *)&output);
    std::ofstream::~ofstream(&outdir);
    SVar10 = cali::OutputStream::type(stream);
    if (SVar10 == None) {
      cali::ConfigManager::Options::get_abi_cxx11_(&outdir,&this->m_opts,"outdir","");
      cali::ConfigManager::Options::get_abi_cxx11_(&output,&this->m_opts,"output","");
      if (output._M_string_length == 0) {
        cali::util::create_filename_abi_cxx11_((string *)&c_1,(util *)".cali",ext);
        std::__cxx11::string::operator=((string *)&output,(string *)&c_1);
        std::__cxx11::string::~string((string *)&c_1);
      }
      if (outdir._M_string_length != 0) {
        bVar9 = std::operator!=(&output,"stderr");
        if (bVar9) {
          bVar9 = std::operator!=(&output,"stdout");
          if (bVar9) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&output_agg,"/",(allocator<char> *)&fmt_attr);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &v_data,&outdir,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &output_agg);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c_1
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &v_data,&output);
            std::__cxx11::string::operator=((string *)&output,(string *)&c_1);
            std::__cxx11::string::~string((string *)&c_1);
            std::__cxx11::string::~string((string *)&v_data);
            std::__cxx11::string::~string((string *)&output_agg);
          }
        }
      }
      cali::Caliper::Caliper(&c_1);
      cali::OutputStream::OutputStream((OutputStream *)&output_agg);
      formatstr = output._M_dataplus;
      cali::Caliper::get_globals((vector<cali::Entry,_std::allocator<cali::Entry>_> *)&v_data,&c_1);
      cali::OutputStream::set_filename
                ((OutputStream *)&output_agg,formatstr._M_p,
                 &c_1.super_CaliperMetadataAccessInterface,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)&v_data);
      std::_Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::~_Vector_base
                ((_Vector_base<cali::Entry,_std::allocator<cali::Entry>_> *)&v_data);
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&outdir);
      std::__shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2> *)
                 stream,(__shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                         *)&output_agg);
      cali::OutputStream::~OutputStream((OutputStream *)&output_agg);
    }
    cali::Caliper::Caliper(&c);
    cali::CaliWriter::CaliWriter(&writer,stream);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outdir,
               " select *,min(inclusive#sum#time.duration) as \"Min time/rank\" unit sec,max(inclusive#sum#time.duration) as \"Max time/rank\" unit sec,avg(inclusive#sum#time.duration) as \"Avg time/rank\" unit sec,sum(inclusive#sum#time.duration) as \"Total time\"    unit sec group by path "
               ,(allocator<char> *)&c_1);
    local_398 = &this->m_opts;
    cali::ConfigManager::Options::build_query(&output,local_398,"cross",&outdir);
    std::__cxx11::string::~string((string *)&outdir);
    parse_spec((QuerySpec *)&outdir,output._M_dataplus._M_p);
    cali::Aggregator::Aggregator(&output_agg,(QuerySpec *)&outdir);
    this_00 = &this->m_db;
    cali::CaliperMetadataDB::add_attribute_aliases(this_00,&local_130);
    cali::CaliperMetadataDB::add_attribute_units(this_00,local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v_data,
               " let sum#time.duration=scale(sum#time.duration.ns,1e-9) select inclusive_sum(sum#time.duration) group by path "
               ,(allocator<char> *)&fmt_attr);
    cali::ConfigManager::Options::build_query((string *)&c_1,local_398,"local",(string *)&v_data);
    std::__cxx11::string::~string((string *)&v_data);
    CVar17._vptr_CaliperMetadataAccessInterface =
         c_1.super_CaliperMetadataAccessInterface._vptr_CaliperMetadataAccessInterface;
    pCVar15 = cali::ChannelController::channel_body((ChannelController *)this);
    local_aggregate((char *)CVar17._vptr_CaliperMetadataAccessInterface,&c,pCVar15,this_00,
                    &output_agg);
    std::__cxx11::string::~string((string *)&c_1);
    (*comm->_vptr_Comm[5])(comm,this_00,&output_agg);
    iVar11 = (*comm->_vptr_Comm[2])(comm);
    uVar8 = outdir.field_2._M_allocated_capacity;
    local_390 = comm;
    if (iVar11 == 0) {
      (this->m_spot_metrics)._M_string_length = 0;
      *(this->m_spot_metrics)._M_dataplus._M_p = '\0';
      pAVar22 = extraout_RDX;
      for (p_Var23 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)outdir._M_string_length;
          p_Var23 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)uVar8; p_Var23 = p_Var23 + 7) {
        if ((this->m_spot_metrics)._M_string_length != 0) {
          std::__cxx11::string::append((char *)&this->m_spot_metrics);
          pAVar22 = extraout_RDX_00;
        }
        cali::Aggregator::get_aggregation_attribute_name_abi_cxx11_
                  ((string *)&c_1,(Aggregator *)p_Var23,pAVar22);
        std::__cxx11::string::append((string *)&this->m_spot_metrics);
        std::__cxx11::string::~string((string *)&c_1);
        pAVar22 = extraout_RDX_01;
      }
      v_data.m_v = cali_make_variant_from_string("regionprofile");
      pNVar16 = cali::CaliperMetadataDB::make_tree_entry
                          (this_00,1,&this->m_channel_attr,&v_data,(Node *)0x0);
      p_Var1 = (_func_int *)(pNVar16->m_data).m_v.type_and_size;
      aVar2 = (pNVar16->m_data).m_v.value;
      c_1.sT = (ThreadData *)0x0;
      c_1.m_is_signal = false;
      c_1._25_7_ = 0;
      c_1._0_16_ = ZEXT816(0);
      CVar17._vptr_CaliperMetadataAccessInterface = (_func_int **)operator_new(0x20);
      comm = local_390;
      *CVar17._vptr_CaliperMetadataAccessInterface = (_func_int *)&writer;
      CVar17._vptr_CaliperMetadataAccessInterface[1] = (_func_int *)pNVar16;
      CVar17._vptr_CaliperMetadataAccessInterface[2] = p_Var1;
      *(anon_union_8_7_33918203_for_value *)(CVar17._vptr_CaliperMetadataAccessInterface + 3) =
           aVar2;
      c_1.super_CaliperMetadataAccessInterface._vptr_CaliperMetadataAccessInterface =
           CVar17._vptr_CaliperMetadataAccessInterface;
      c_1._24_8_ = std::
                   _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:423:17)>
                   ::_M_invoke;
      c_1.sT = (ThreadData *)
               std::
               _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:423:17)>
               ::_M_manager;
      cali::Aggregator::flush
                (&output_agg,&this_00->super_CaliperMetadataAccessInterface,
                 (SnapshotProcessFn *)&c_1);
      std::_Function_base::~_Function_base((_Function_base *)&c_1);
    }
    cali::Aggregator::~Aggregator(&output_agg);
    cali::QuerySpec::~QuerySpec((QuerySpec *)&outdir);
    std::__cxx11::string::~string((string *)&output);
    bVar9 = cali::ConfigManager::Options::is_enabled(local_398,"timeseries");
    if (bVar9) {
      cali::ConfigManager::get_channel((ConfigManager *)&p,(char *)&this->m_timeseries_mgr);
      if (p.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::ofstream::ofstream(&outdir);
        local_50 = 0;
        poVar14 = cali::Log::stream((Log *)&outdir);
        poVar14 = std::operator<<(poVar14,"[spot controller]: Timeseries channel not found!");
        std::endl<char,std::char_traits<char>>(poVar14);
        std::ofstream::~ofstream(&outdir);
      }
      else {
        tsc.
        super___shared_ptr<(anonymous_namespace)::SpotTimeseriesController,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)
                  __dynamic_cast(p.
                                 super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&cali::ChannelController::typeinfo,
                                 &(anonymous_namespace)::SpotTimeseriesController::typeinfo,0);
        if (tsc.
            super___shared_ptr<(anonymous_namespace)::SpotTimeseriesController,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          tsc.
          super___shared_ptr<(anonymous_namespace)::SpotTimeseriesController,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          tsc.
          super___shared_ptr<(anonymous_namespace)::SpotTimeseriesController,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
                    (&tsc.
                      super___shared_ptr<(anonymous_namespace)::SpotTimeseriesController,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     &p.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        cali::CalQLParser::CalQLParser
                  ((CalQLParser *)&output,
                   "aggregate max(sum#loop.iterations),max(count) group by loop");
        cali::CalQLParser::spec((QuerySpec *)&outdir,(CalQLParser *)&output);
        cali::Aggregator::Aggregator(&summary_cross_agg,(QuerySpec *)&outdir);
        cali::QuerySpec::~QuerySpec((QuerySpec *)&outdir);
        cali::CalQLParser::~CalQLParser((CalQLParser *)&output);
        pCVar15 = cali::ChannelController::channel_body
                            (&(tsc.
                               super___shared_ptr<(anonymous_namespace)::SpotTimeseriesController,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super_ChannelController);
        local_aggregate("aggregate count(),sum(loop.iterations) where loop group by loop",&c,pCVar15
                        ,this_00,&summary_cross_agg);
        (*comm->_vptr_Comm[5])(comm,this_00,&summary_cross_agg);
        fmt_attr.m_node = (Node *)&infovec;
        infovec.
        super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        infovec.
        super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        infovec.
        super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cali::Aggregator::flush
                  (&summary_cross_agg,&this_00->super_CaliperMetadataAccessInterface,
                   (SnapshotProcessFn *)&fmt_attr);
        std::_Function_base::~_Function_base((_Function_base *)&fmt_attr);
        pLVar7 = infovec.
                 super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (infovec.
            super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            infovec.
            super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::ofstream::ofstream(&outdir);
          local_50 = 1;
          poVar14 = cali::Log::stream((Log *)&outdir);
          poVar14 = std::operator<<(poVar14,"[spot controller]: No instrumented loops found");
          std::endl<char,std::char_traits<char>>(poVar14);
          std::ofstream::~ofstream(&outdir);
        }
        else {
          for (pLVar18 = infovec.
                         super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              peVar6 = tsc.
                       super___shared_ptr<(anonymous_namespace)::SpotTimeseriesController,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr, pCVar5 = local_390, pLVar18 != pLVar7; pLVar18 = pLVar18 + 1) {
            if (0 < pLVar18->iterations) {
              uVar12 = (*local_390->_vptr_Comm[3])(local_390);
              iVar11 = (*pCVar5->_vptr_Comm[3])(pCVar5,(ulong)(uint)pLVar18->count);
              (*pCVar5->_vptr_Comm[4])(&v_data,pCVar5,pLVar18);
              if (0 < (int)uVar12) {
                bVar9 = cali::ConfigManager::Options::is_set(local_398,"timeseries.maxrows");
                uVar13 = 0x14;
                if (bVar9) {
                  cali::ConfigManager::Options::get_abi_cxx11_
                            (&output,local_398,"timeseries.maxrows","");
                  std::__cxx11::string::string((string *)&outdir,(string *)&output);
                  uVar13 = cali::StringConverter::to_int((StringConverter *)&outdir,(bool *)0x0);
                  std::__cxx11::string::~string((string *)&outdir);
                  std::__cxx11::string::~string((string *)&output);
                  uVar24 = 1;
                  if (0 < (int)uVar13) goto LAB_00224e00;
                }
                else {
LAB_00224e00:
                  uVar24 = 1;
                  if ((int)uVar13 < iVar11) {
                    uVar24 = uVar12 / uVar13;
                  }
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&c_1,
                           " select cali.channel,loop,block,max(sum#loop.iterations) as \"Iterations\" unit iterations,max(scale#time.duration.ns) as \"Time (s)\" unit sec,avg(ratio#loop.iterations/time.duration.ns) as \"Iter/s\" unit iter/s group by cali.channel,loop,block "
                           ,(allocator<char> *)&output_agg);
                cali::ConfigManager::Options::build_query
                          (&output,&peVar6->m_opts,"cross",(string *)&c_1);
                std::__cxx11::string::~string((string *)&c_1);
                parse_spec((QuerySpec *)&outdir,output._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&output);
                cali::Aggregator::Aggregator(&cross_agg,(QuerySpec *)&outdir);
                cali::CaliperMetadataDB::add_attribute_aliases(this_00,&local_130);
                cali::CaliperMetadataDB::add_attribute_units(this_00,local_100);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&output_agg,(char *)v_data.m_v.type_and_size,&local_399);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&output,
                           " select cali.channel,loop,block,scale(time.duration.ns,1e-9),sum(loop.iterations),ratio(loop.iterations,time.duration.ns,1e9) group by cali.channel,loop,block "
                           ,(allocator<char> *)&c_1);
                psVar19 = (string *)std::__cxx11::string::append((char *)&output);
                std::__cxx11::to_string((string *)&c_1,uVar24 + (uVar24 == 0));
                pcVar20 = (char *)std::__cxx11::string::append(psVar19);
                std::__cxx11::string::append(pcVar20);
                std::__cxx11::string::~string((string *)&c_1);
                psVar19 = (string *)std::__cxx11::string::append((char *)&output);
                pcVar20 = (char *)std::__cxx11::string::append(psVar19);
                std::__cxx11::string::append(pcVar20);
                cali::ConfigManager::Options::build_query
                          ((string *)&c_1,&peVar6->m_opts,"local",&output);
                cali::ChannelController::channel((ChannelController *)&chn_attr);
                if (((element_type *)local_340._M_pi != (element_type *)0x0) &&
                   (0 < (int)*(size_type *)&(local_340._M_pi)->_M_use_count)) {
                  local_aggregate((char *)c_1.super_CaliperMetadataAccessInterface.
                                          _vptr_CaliperMetadataAccessInterface,&c,
                                  (ChannelBody *)chn_attr.m_node,this_00,&cross_agg);
                }
                cali::Channel::~Channel((Channel *)&chn_attr);
                std::__cxx11::string::~string((string *)&c_1);
                std::__cxx11::string::~string((string *)&output);
                std::__cxx11::string::~string((string *)&output_agg);
                (*local_390->_vptr_Comm[5])(local_390,this_00,&cross_agg);
                iVar11 = (*local_390->_vptr_Comm[2])();
                uVar8 = outdir.field_2._M_allocated_capacity;
                if (iVar11 == 0) {
                  (this->m_spot_timeseries_metrics)._M_string_length = 0;
                  *(this->m_spot_timeseries_metrics)._M_dataplus._M_p = '\0';
                  pAVar22 = extraout_RDX_02;
                  for (p_Var23 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                 outdir._M_string_length;
                      p_Var23 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)uVar8;
                      p_Var23 = p_Var23 + 7) {
                    if ((this->m_spot_timeseries_metrics)._M_string_length != 0) {
                      std::__cxx11::string::append((char *)&this->m_spot_timeseries_metrics);
                      pAVar22 = extraout_RDX_03;
                    }
                    cali::Aggregator::get_aggregation_attribute_name_abi_cxx11_
                              (&output,(Aggregator *)p_Var23,pAVar22);
                    std::__cxx11::string::append((string *)&this->m_spot_timeseries_metrics);
                    std::__cxx11::string::~string((string *)&output);
                    pAVar22 = extraout_RDX_04;
                  }
                  c_1._0_16_ = cali_make_variant_from_string("timeseries");
                  pNVar16 = cali::CaliperMetadataDB::make_tree_entry
                                      (this_00,1,&this->m_channel_attr,(Variant *)&c_1,(Node *)0x0);
                  uVar3 = (pNVar16->m_data).m_v.type_and_size;
                  aVar2 = (pNVar16->m_data).m_v.value;
                  output.field_2._M_allocated_capacity = 0;
                  output.field_2._8_8_ = 0;
                  output._M_dataplus._M_p = (pointer)0x0;
                  output._M_string_length = 0;
                  output._M_dataplus._M_p = (pointer)operator_new(0x20);
                  *(CaliWriter **)output._M_dataplus._M_p = &writer;
                  *(Node **)((long)output._M_dataplus._M_p + 8) = pNVar16;
                  *(uint64_t *)((long)output._M_dataplus._M_p + 0x10) = uVar3;
                  *(anon_union_8_7_33918203_for_value *)((long)output._M_dataplus._M_p + 0x18) =
                       aVar2;
                  output.field_2._8_8_ =
                       std::
                       _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:330:21)>
                       ::_M_invoke;
                  output.field_2._M_allocated_capacity =
                       (size_type)
                       std::
                       _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:330:21)>
                       ::_M_manager;
                  cali::Aggregator::flush
                            (&cross_agg,&this_00->super_CaliperMetadataAccessInterface,
                             (SnapshotProcessFn *)&output);
                  std::_Function_base::~_Function_base((_Function_base *)&output);
                }
                cali::Aggregator::~Aggregator(&cross_agg);
                cali::QuerySpec::~QuerySpec((QuerySpec *)&outdir);
              }
              std::__cxx11::string::~string((string *)&v_data);
            }
          }
        }
        std::
        vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>::
        ~vector(&infovec);
        cali::Aggregator::~Aggregator(&summary_cross_agg);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tsc.
                    super___shared_ptr<(anonymous_namespace)::SpotTimeseriesController,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        comm = local_390;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    iVar11 = (*comm->_vptr_Comm[2])(comm);
    if (iVar11 == 0) {
      pCVar15 = cali::ChannelController::channel_body((ChannelController *)this);
      cali::Caliper::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)&outdir,&c,pCVar15);
      cali::CaliperMetadataDB::import_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)&local_48,this_00,
                 &c.super_CaliperMetadataAccessInterface,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)&outdir);
      std::_Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::~_Vector_base(&local_48);
      std::_Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::~_Vector_base
                ((_Vector_base<cali::Entry,_std::allocator<cali::Entry>_> *)&outdir);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outdir,"regionprofile",(allocator<char> *)&output);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"",(allocator<char> *)&c_1);
      cali::ConfigManager::Options::enabled_options_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&c_1,local_398);
      pGVar4 = c_1.sG;
      for (CVar17._vptr_CaliperMetadataAccessInterface =
                c_1.super_CaliperMetadataAccessInterface._vptr_CaliperMetadataAccessInterface;
          (GlobalData *)CVar17._vptr_CaliperMetadataAccessInterface != pGVar4;
          CVar17._vptr_CaliperMetadataAccessInterface =
               (_func_int **)
               &(((GlobalData *)CVar17._vptr_CaliperMetadataAccessInterface)->attribute_lock).
                super___mutex_base._M_mutex.__data.__list.__next) {
        if (output._M_string_length != 0) {
          std::__cxx11::string::append((char *)&output);
        }
        std::__cxx11::string::append((string *)&output);
        bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CVar17._vptr_CaliperMetadataAccessInterface,"timeseries");
        if (bVar9) {
          std::__cxx11::string::append((char *)&outdir);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&c_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&c_1,"spot.metrics",(allocator<char> *)&output_agg);
      AVar21 = cali::CaliperMetadataDB::create_attribute
                         (this_00,(string *)&c_1,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                          (Variant *)0x0);
      v_data.m_v.type_and_size = (uint64_t)AVar21.m_node;
      std::__cxx11::string::~string((string *)&c_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&c_1,"spot.timeseries.metrics",(allocator<char> *)&fmt_attr);
      output_agg.mP.super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                cali::CaliperMetadataDB::create_attribute
                          (this_00,(string *)&c_1,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                           (Variant *)0x0);
      std::__cxx11::string::~string((string *)&c_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&c_1,"spot.format.version",(allocator<char> *)&infovec);
      fmt_attr = cali::CaliperMetadataDB::create_attribute
                           (this_00,(string *)&c_1,CALI_TYPE_INT,0x200,0,(Attribute *)0x0,
                            (Variant *)0x0);
      std::__cxx11::string::~string((string *)&c_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&c_1,"spot.options",(allocator<char> *)&chn_attr);
      infovec.
      super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)cali::CaliperMetadataDB::create_attribute
                              (this_00,(string *)&c_1,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                               (Variant *)0x0);
      std::__cxx11::string::~string((string *)&c_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&c_1,"spot.channels",(allocator<char> *)&cross_agg);
      chn_attr = cali::CaliperMetadataDB::create_attribute
                           (this_00,(string *)&c_1,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                            (Variant *)0x0);
      std::__cxx11::string::~string((string *)&c_1);
      c_1._0_16_ = cali_make_variant_from_string((this->m_spot_metrics)._M_dataplus._M_p);
      cali::CaliperMetadataDB::set_global(this_00,(Attribute *)&v_data,(Variant *)&c_1);
      c_1._0_16_ = cali_make_variant_from_string((this->m_spot_timeseries_metrics)._M_dataplus._M_p)
      ;
      cali::CaliperMetadataDB::set_global(this_00,(Attribute *)&output_agg,(Variant *)&c_1);
      c_1.sG = (GlobalData *)0x2;
      c_1.super_CaliperMetadataAccessInterface._vptr_CaliperMetadataAccessInterface =
           (_func_int **)0x2;
      cali::CaliperMetadataDB::set_global(this_00,&fmt_attr,(Variant *)&c_1);
      c_1._0_16_ = cali_make_variant_from_string(output._M_dataplus._M_p);
      cali::CaliperMetadataDB::set_global(this_00,(Attribute *)&infovec,(Variant *)&c_1);
      c_1._0_16_ = cali_make_variant_from_string(outdir._M_dataplus._M_p);
      cali::CaliperMetadataDB::set_global(this_00,&chn_attr,(Variant *)&c_1);
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&outdir);
      cali::CaliperMetadataDB::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)&outdir,this_00);
      cali::CaliWriter::write_globals
                (&writer,&this_00->super_CaliperMetadataAccessInterface,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)&outdir);
      std::_Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::~_Vector_base
                ((_Vector_base<cali::Entry,_std::allocator<cali::Entry>_> *)&outdir);
      std::ofstream::ofstream(&outdir);
      local_50 = 1;
      poVar14 = cali::Log::stream((Log *)&outdir);
      cali::ChannelController::name_abi_cxx11_(&output,(ChannelController *)this);
      poVar14 = std::operator<<(poVar14,(string *)&output);
      poVar14 = std::operator<<(poVar14,": Wrote ");
      cali::CaliWriter::num_written(&writer);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
      poVar14 = std::operator<<(poVar14," records.");
      std::endl<char,std::char_traits<char>>(poVar14);
      std::__cxx11::string::~string((string *)&output);
      std::ofstream::~ofstream(&outdir);
    }
    cali::CaliWriter::~CaliWriter(&writer);
  }
  else {
    std::ofstream::ofstream((Log *)&outdir);
    local_50 = 0;
    poVar14 = cali::Log::stream((Log *)&outdir);
    cali::ChannelController::name_abi_cxx11_(&output,(ChannelController *)this);
    poVar14 = std::operator<<(poVar14,(string *)&output);
    std::operator<<(poVar14,": SpotController: channel not instantiated\n");
    std::__cxx11::string::~string((string *)&output);
    std::ofstream::~ofstream(&outdir);
  }
  return;
}

Assistant:

void collective_flush(OutputStream& stream, Comm& comm) override
    {
        if (!is_instantiated()) {
            Log(0).stream() << name() << ": SpotController: channel not instantiated\n";
            return;
        }

        Log(1).stream() << name() << ": Flushing Caliper data" << std::endl;

        if (stream.type() == OutputStream::None)
            stream = create_output_stream();

        Caliper    c;
        CaliWriter writer(stream);

        flush_regionprofile(c, writer, comm);

        if (m_opts.is_enabled("timeseries"))
            flush_timeseries(c, writer, comm);

        if (comm.rank() == 0) {
            m_db.import_globals(c, c.get_globals(channel_body()));
            save_spot_metadata();
            writer.write_globals(m_db, m_db.get_globals());

            Log(1).stream() << name() << ": Wrote " << writer.num_written() << " records." << std::endl;
        }
    }